

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O0

void dg::llvmutils::printerr(char *msg,Value *val,bool newline)

{
  bool newline_00;
  byte in_DL;
  char *in_RSI;
  raw_ostream *in_RDI;
  Value *unaff_retaddr;
  
  newline_00 = (bool)(in_DL & 1);
  llvm::errs();
  print(unaff_retaddr,in_RDI,in_RSI,newline_00);
  return;
}

Assistant:

inline void printerr(const char *msg, const Value *val, bool newline = true) {
    print(val, errs(), msg, newline);
}